

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O3

bool __thiscall
CompareBoundaryRelation::WedgesCross
          (CompareBoundaryRelation *this,S2Point *a0,S2Point *ab1,S2Point *a2,S2Point *b0,
          S2Point *b2)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  
  this->found_shared_vertex_ = true;
  lVar4 = 0;
  do {
    dVar1 = *(double *)((long)b2->c_ + lVar4);
    dVar2 = *(double *)((long)a0->c_ + lVar4);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar6 = lVar4 != 0x10;
    lVar4 = lVar4 + 8;
  } while (bVar6);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    lVar4 = 0;
    do {
      dVar1 = *(double *)((long)b2->c_ + lVar4);
      dVar2 = *(double *)((long)a2->c_ + lVar4);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar6 = lVar4 != 0x10;
      lVar4 = lVar4 + 8;
    } while (bVar6);
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_001fec1a;
    bVar6 = s2pred::OrderedCCW(a0,a2,b2,ab1);
    if (bVar6) goto LAB_001fec6c;
  }
  else {
LAB_001fec1a:
    lVar4 = 0;
    do {
      dVar1 = *(double *)((long)b2->c_ + lVar4);
      dVar2 = *(double *)((long)a0->c_ + lVar4);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar6 = lVar4 != 0x10;
      lVar4 = lVar4 + 8;
    } while (bVar6);
    if ((dVar1 == dVar2) == this->reverse_b_) {
LAB_001fec6c:
      this->contains_edge_ = true;
      bVar3 = this->excludes_edge_;
      bVar5 = 1;
      goto LAB_001fec75;
    }
  }
  this->excludes_edge_ = true;
  bVar5 = this->contains_edge_;
  bVar3 = 1;
LAB_001fec75:
  return (bVar3 & bVar5) != 0;
}

Assistant:

bool WedgesCross(const S2Point& a0, const S2Point& ab1, const S2Point& a2,
                   const S2Point& b0, const S2Point& b2) override {
    // Because we don't care about the interior of B, only its boundary, it is
    // sufficient to check whether A contains the semiwedge (ab1, b2).
    found_shared_vertex_ = true;
    if (WedgeContainsSemiwedge(a0, ab1, a2, b2, reverse_b_)) {
      contains_edge_ = true;
    } else {
      excludes_edge_ = true;
    }
    return contains_edge_ & excludes_edge_;
  }